

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  pointer *pppTVar1;
  vector<int,_std::allocator<int>_> *this_00;
  pointer *this_01;
  ContextInfo *pCVar2;
  TestLog *pTVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  uint uVar8;
  int extraout_EAX;
  int *value_00;
  pointer *pppTVar9;
  Texture2D *this_02;
  TextureCube *this_03;
  pointer *pppTVar10;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *p_Var11;
  MultiTexShader *this_04;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int i;
  long lVar17;
  float fVar18;
  byte local_344;
  Random rnd;
  TextureParameters params;
  RGBA local_2ec;
  RGBA local_2e8;
  value_type_conflict4 local_2e4;
  vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *local_2e0;
  vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *local_2d8;
  vector<int,_std::allocator<int>_> *local_2d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2c8;
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  *local_2c0;
  ulong local_2b8;
  long local_2b0;
  long local_2a8;
  PixelBufferAccess access;
  Vec4 cScale;
  Vec4 cBias;
  string local_238;
  string local_218;
  Vector<float,_4> local_1f8;
  Vector<float,_4> local_1e8;
  Vec4 local_1d8;
  Vector<float,_4> local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  
  iVar5 = this->m_numUnitsParam;
  if (iVar5 < 1) {
    pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar5 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8872);
  }
  this->m_numUnits = iVar5;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&rnd.m_rnd,this->m_randSeed);
  fVar18 = deRandom_getFloat(&rnd.m_rnd);
  value_00 = &this->m_numUnits;
  iVar5 = *value_00;
  if (0.7 <= fVar18) {
    iVar15 = 1;
    if (1 < iVar5 + -2) {
      iVar15 = iVar5 + -2;
    }
    iVar5 = de::Random::getInt(&rnd,iVar15,iVar5);
  }
  this->m_numTextures = iVar5;
  this_01 = &unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  de::toString<int>(&local_218,value_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cScale,
                 "Using ",&local_218);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cBias,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cScale,
                 " texture unit(s) and ");
  value = &this->m_numTextures;
  de::toString<int>(&local_238,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cBias,
                 &local_238);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&access,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                 " texture(s)");
  std::operator<<((ostream *)this_01,(char *)access.super_ConstPixelBufferAccess.m_format);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&unitTypes,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&access);
  std::__cxx11::string::~string((string *)&params);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&cBias);
  std::__cxx11::string::~string((string *)&cScale);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  local_2c8 = &this->m_textureTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_2c8,(long)this->m_numTextures);
  local_2c0 = &this->m_textureParams;
  std::
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve(local_2c0,(long)this->m_numTextures);
  local_2d0 = &this->m_ndx2dOrCube;
  std::vector<int,_std::allocator<int>_>::reserve(local_2d0,(long)this->m_numTextures);
  local_2d8 = (vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *)&this->m_texturesCube;
  pppTVar1 = &(this->m_texturesCube).
              super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *)&this->m_textures2d;
  pppTVar9 = &(this->m_textures2d).
              super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  uVar12 = 0;
  do {
    if (*value <= (int)uVar12) {
      this_00 = &this->m_unitTextures;
      std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)this->m_numUnits);
      iVar5 = 0;
      while (unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start =
                  (pointer)CONCAT44(unitTypes.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,iVar5),
            iVar5 < *value) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (this_00,(value_type_conflict1 *)&unitTypes);
        iVar5 = (int)unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
      }
      while( true ) {
        last._M_current =
             (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        first._M_current =
             (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (this->m_numUnits <= (int)((ulong)((long)last._M_current - (long)first._M_current) >> 2))
        break;
        iVar5 = de::Random::getInt(&rnd,0,*value + -1);
        unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(unitTypes.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&unitTypes);
      }
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (&rnd,first,last);
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&unitTypes,(long)*value_00);
      for (lVar17 = 0; lVar17 < *value_00; lVar17 = lVar17 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&unitTypes,
                   (local_2c8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start +
                   (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar17]);
      }
      this_04 = (MultiTexShader *)operator_new(0x1a0);
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      MultiTexShader::MultiTexShader(this_04,dVar6,*value_00,&unitTypes);
      this->m_shader = this_04;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return extraout_EAX;
    }
    if (this->m_caseType == CASE_ONLY_CUBE) {
LAB_00ec133e:
      uVar8 = 0x100;
      local_2e4 = 0x8513;
      local_344 = 0;
    }
    else {
      if (this->m_caseType != CASE_ONLY_2D) {
        bVar4 = de::Random::getBool(&rnd);
        if (!bVar4) goto LAB_00ec133e;
      }
      uVar8 = 0x80;
      local_344 = 1;
      local_2e4 = 0xde1;
    }
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    params.wrapModeS = *(GLenum *)(s_testWrapModes + ((ulong)dVar6 % 3) * 4);
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    params.wrapModeT = *(GLenum *)(s_testWrapModes + ((ulong)dVar6 % 3) * 4);
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    params.magFilter = (&deqp::gles3::Functional::s_testMagFilters)[dVar6 & 1];
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    params.dataType = *(GLenum *)(s_testDataTypes + (ulong)(dVar6 & 3) * 4);
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    params.minFilter = *(GLenum *)(s_testMinFilters + ((ulong)dVar6 % 6) * 4);
    if (params.dataType == 0x8363) {
      params.format = 0x1907;
    }
    else if (params.dataType - 0x8033 < 2) {
      params.format = 0x1908;
    }
    else {
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      params.format = *(GLenum *)(s_testFormats + ((ulong)dVar6 % 5) * 4);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_2c8,&local_2e4);
    std::
    vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
    ::push_back(local_2c0,&params);
    if (local_344 == 0) {
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(unitTypes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (int)((ulong)((long)*pppTVar1 - *(long *)local_2d8) >> 3));
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_2d0,(int *)&unitTypes);
      this_03 = (TextureCube *)operator_new(0x168);
      access.super_ConstPixelBufferAccess.m_format =
           glu::mapGLTransferFormat(params.format,params.dataType);
      tcu::TextureCube::TextureCube(this_03,(TextureFormat *)&access,uVar8);
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_03;
      std::vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>>::
      emplace_back<tcu::TextureCube*>(local_2d8,(TextureCube **)&unitTypes);
      pppTVar10 = pppTVar1;
    }
    else {
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(unitTypes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (int)((ulong)((long)*pppTVar9 - *(long *)local_2e0) >> 3));
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_2d0,(int *)&unitTypes);
      this_02 = (Texture2D *)operator_new(0x50);
      access.super_ConstPixelBufferAccess.m_format =
           glu::mapGLTransferFormat(params.format,params.dataType);
      tcu::Texture2D::Texture2D(this_02,(TextureFormat *)&access,uVar8,uVar8);
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_02;
      std::vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>>::emplace_back<tcu::Texture2D*>
                (local_2e0,(Texture2D **)&unitTypes);
      pppTVar10 = (pointer *)pppTVar9;
    }
    tcu::getTextureFormatInfo((TextureFormatInfo *)&unitTypes,&(*pppTVar10)[-1]->m_format);
    tcu::Vector<float,_4>::Vector(&cBias,(Vector<float,_4> *)&unitTypes);
    tcu::operator-((tcu *)&cScale,
                   (Vector<float,_4> *)
                   &unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Vector<float,_4> *)&unitTypes
                  );
    uVar16 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    local_2b0 = (ulong)(local_344 ^ 1) * 5 + 1;
    local_2a8 = (ulong)uVar16 * 0x28 + 0x28;
    local_2b8 = uVar12;
    for (lVar17 = 0; lVar17 != local_2b0; lVar17 = lVar17 + 1) {
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      uVar16 = 0xff000000;
      uVar8 = 0xff000000;
      if (params.format == 0x1906) {
        dVar7 = deRandom_getUint32(&rnd.m_rnd);
        uVar16 = dVar7 & 0xff000000;
        uVar8 = ~uVar16;
      }
      iVar5 = 0;
      for (lVar13 = 0; local_2a8 != lVar13; lVar13 = lVar13 + 0x28) {
        if (local_344 == 0) {
          tcu::TextureCube::allocLevel((*pppTVar1)[-1],(CubeFace)lVar17,iVar5);
          uVar14 = 8 >> ((byte)iVar5 & 0x1f);
          iVar15 = uVar14 + (uVar14 == 0);
          p_Var11 = &(*pppTVar1)[-1]->m_access[lVar17].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          ;
        }
        else {
          tcu::Texture2D::allocLevel((*pppTVar9)[-1],iVar5);
          uVar14 = 8 >> ((byte)iVar5 & 0x1f);
          iVar15 = uVar14 + (uVar14 == 0);
          p_Var11 = &((*pppTVar9)[-1]->super_TextureLevelPyramid).m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          ;
        }
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&access.super_ConstPixelBufferAccess,
                   (ConstPixelBufferAccess *)
                   ((long)(((p_Var11->_M_impl).super__Vector_impl_data._M_start)->
                          super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -8));
        local_2e8.m_value = uVar16 | dVar6 & 0xffffff;
        tcu::RGBA::toVec(&local_2e8);
        tcu::operator*((tcu *)&local_238,&local_1c8,&cScale);
        tcu::operator+((tcu *)&local_218,(Vector<float,_4> *)&local_238,&cBias);
        local_2ec.m_value = ~(dVar6 & 0xffffff) | uVar8;
        tcu::RGBA::toVec(&local_2ec);
        tcu::operator*((tcu *)&local_1e8,&local_1f8,&cScale);
        tcu::operator+((tcu *)&local_1d8,&local_1e8,&cBias);
        tcu::fillWithGrid(&access,iVar15,(Vec4 *)&local_218,&local_1d8);
        iVar5 = iVar5 + 1;
      }
    }
    uVar12 = (ulong)((int)local_2b8 + 1);
  } while( true );
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndx2dOrCube.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types (2d or cube), and randomized parameters for every texture.

			TextureParameters	params;
			bool				is2d		= m_caseType == CASE_ONLY_2D	? true :
											  m_caseType == CASE_ONLY_CUBE	? false :
																			  rnd.getBool();

			GLenum				type		= is2d ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
			const int			texWidth	= is2d ? TEXTURE_WIDTH_2D : TEXTURE_WIDTH_CUBE;
			const int			texHeight	= is2d ? TEXTURE_HEIGHT_2D : TEXTURE_HEIGHT_CUBE;
			bool				mipmaps		= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight));
			int					numLevels	= mipmaps ? deLog2Floor32(de::max(texWidth, texHeight))+1 : 1;

			params.wrapModeS	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.magFilter	= s_testMagFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)];
			params.dataType		= s_testDataTypes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes) - 1)];

			// Certain minification filters are only used when using mipmaps.
			if (mipmaps)
				params.minFilter = s_testMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)];
			else
				params.minFilter = s_testNonMipmapMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)];

			// Format may depend on data type.
			if (params.dataType == GL_UNSIGNED_SHORT_5_6_5)
				params.format = GL_RGB;
			else if (params.dataType == GL_UNSIGNED_SHORT_4_4_4_4 || params.dataType == GL_UNSIGNED_SHORT_5_5_5_1)
				params.format = GL_RGBA;
			else
				params.format = s_testFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testFormats) - 1)];

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			if (is2d)
			{
				m_ndx2dOrCube.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d array.
				m_textures2d.push_back(new tcu::Texture2D(glu::mapGLTransferFormat(params.format, params.dataType), texWidth, texHeight));
			}
			else
			{
				m_ndx2dOrCube.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube array.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(glu::mapGLTransferFormat(params.format, params.dataType), texWidth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(is2d ? m_textures2d.back()->getFormat() : m_texturesCube.back()->getFormat());
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = is2d ? 1 : (int)tcu::CUBEFACE_LAST;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha0	= 0xff000000;
				deUint32 alpha1	= 0xff000000;

				if (params.format == GL_ALPHA) // \note This needs alpha to be visible.
				{
					alpha0 &= rnd.getUint32();
					alpha1 = ~alpha0;
				}

				deUint32 colorA = alpha0 | rgb;
				deUint32 colorB = alpha1 | ~rgb;

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2d)
						m_textures2d.back()->allocLevel(levelNdx);
					else
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2d ? m_textures2d.back()->getLevel(levelNdx) : m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face);
					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Create shader.

		vector<GLenum> unitTypes;
		unitTypes.reserve(m_numUnits);
		for (int i = 0; i < m_numUnits; i++)
			unitTypes.push_back(m_textureTypes[m_unitTextures[i]]);

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}